

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.cpp
# Opt level: O0

bool duckdb::TryAddOperator::Operation<duckdb::date_t,int,duckdb::date_t>
               (date_t left,int32_t right,date_t *result)

{
  bool bVar1;
  int32_t *in_RDX;
  int32_t in_EDI;
  int32_t days;
  int32_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int32_t right_00;
  int32_t in_stack_ffffffffffffffd4;
  int32_t local_28;
  date_t local_20;
  date_t local_1c;
  int32_t *local_18;
  date_t local_8;
  bool local_1;
  
  local_18 = in_RDX;
  local_8.days = in_EDI;
  local_1c = date_t::infinity();
  bVar1 = date_t::operator==(&local_8,&local_1c);
  right_00 = CONCAT13(1,(int3)in_stack_ffffffffffffffd0);
  if (!bVar1) {
    local_20 = date_t::ninfinity();
    bVar1 = date_t::operator==(&local_8,&local_20);
    right_00 = CONCAT13(bVar1,(int3)right_00);
  }
  if ((char)((uint)right_00 >> 0x18) == '\0') {
    bVar1 = Operation<int,int,int>(in_stack_ffffffffffffffd4,right_00,in_stack_ffffffffffffffc8);
    if (bVar1) {
      *local_18 = local_28;
      bVar1 = Value::IsFinite<duckdb::date_t>((date_t)0x0);
      if (bVar1) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    *local_18 = local_8.days;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool TryAddOperator::Operation(date_t left, int32_t right, date_t &result) {
	if (left == date_t::infinity() || left == date_t::ninfinity()) {
		result = date_t(left);
		return true;
	}
	int32_t days;
	if (!TryAddOperator::Operation(left.days, right, days)) {
		return false;
	}
	result.days = days;
	if (!Value::IsFinite(result)) {
		return false;
	}
	return true;
}